

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

int __thiscall
cmCTest::RunMakeCommand
          (cmCTest *this,char *command,string *output,int *retVal,char *dir,int timeout,ostream *ofs
          )

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  char *pcVar5;
  cmsysProcess *cp_00;
  reference ppcVar6;
  ostream *poVar7;
  ulong uVar8;
  undefined8 uVar9;
  void *pvVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  string local_1450 [32];
  undefined1 local_1430 [8];
  ostringstream cmCTestLog_msg_11;
  string local_12b8 [32];
  undefined1 local_1298 [8];
  ostringstream cmCTestLog_msg_10;
  string local_1120 [32];
  undefined1 local_1100 [8];
  ostringstream cmCTestLog_msg_9;
  string local_f88 [32];
  undefined1 local_f68 [8];
  ostringstream cmCTestLog_msg_8;
  string local_de8 [4];
  int result;
  undefined1 local_dc8 [8];
  ostringstream cmCTestLog_msg_7;
  cmCTestLogWrite local_c50;
  string local_c40 [32];
  cmCTestLogWrite local_c20;
  undefined1 local_c10 [8];
  ostringstream cmCTestLog_msg_6;
  string local_a98 [32];
  undefined1 local_a78 [8];
  ostringstream cmCTestLog_msg_5;
  string local_900 [32];
  undefined1 local_8e0 [8];
  ostringstream cmCTestLog_msg_4;
  int local_764;
  string local_760 [4];
  int cc;
  undefined1 local_740 [8];
  ostringstream cmCTestLog_msg_3;
  int local_5c4;
  char *pcStack_5c0;
  int length;
  char *data;
  size_type tick_line_len;
  size_type tick_len;
  size_type tick;
  cmsysProcess *local_598;
  cmsysProcess *cp;
  ostringstream local_570 [8];
  ostringstream cmCTestLog_msg_2;
  string local_3f8 [32];
  undefined1 local_3d8 [8];
  ostringstream cmCTestLog_msg_1;
  __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
  local_260;
  char **local_258;
  __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
  local_250;
  iterator ait;
  undefined1 local_228 [8];
  ostringstream cmCTestLog_msg;
  value_type local_b0 [3];
  value_type local_98;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_90;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_88;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_80;
  const_iterator a;
  vector<const_char_*,_std::allocator<const_char_*>_> argv;
  undefined1 local_58 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  int timeout_local;
  char *dir_local;
  int *retVal_local;
  string *output_local;
  char *command_local;
  cmCTest *this_local;
  
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = timeout;
  cmSystemTools::ParseArguments_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_58,(cmSystemTools *)command,(char *)output);
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_58);
  if (sVar4 == 0) {
    this_local._4_4_ = 0;
  }
  else {
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)&a);
    local_88._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_58);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_80,&local_88);
    while( true ) {
      local_90._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_58);
      bVar1 = __gnu_cxx::operator!=(&local_80,&local_90);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator->(&local_80);
      local_98 = (value_type)std::__cxx11::string::c_str();
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)&a,&local_98);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_80);
    }
    local_b0[0] = (value_type)0x0;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)&a,local_b0);
    std::__cxx11::string::operator=((string *)output,"");
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
    std::operator<<((ostream *)local_228,"Run command:");
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    Log(this,3,
        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmCTest.cxx"
        ,0x49c,pcVar5,false);
    std::__cxx11::string::~string((string *)&ait);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_228);
    __gnu_cxx::
    __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>::
    __normal_iterator(&local_250);
    local_258 = (char **)std::vector<const_char_*,_std::allocator<const_char_*>_>::begin
                                   ((vector<const_char_*,_std::allocator<const_char_*>_> *)&a);
    local_250._M_current = local_258;
    while( true ) {
      local_260._M_current =
           (char **)std::vector<const_char_*,_std::allocator<const_char_*>_>::end
                              ((vector<const_char_*,_std::allocator<const_char_*>_> *)&a);
      bVar2 = __gnu_cxx::operator!=(&local_250,&local_260);
      bVar1 = false;
      if (bVar2) {
        ppcVar6 = __gnu_cxx::
                  __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                  ::operator*(&local_250);
        bVar1 = *ppcVar6 != (char *)0x0;
      }
      if (!bVar1) break;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3d8);
      poVar7 = std::operator<<((ostream *)local_3d8," \"");
      ppcVar6 = __gnu_cxx::
                __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                ::operator*(&local_250);
      poVar7 = std::operator<<(poVar7,*ppcVar6);
      std::operator<<(poVar7,"\"");
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      Log(this,3,
          "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmCTest.cxx"
          ,0x4a0,pcVar5,false);
      std::__cxx11::string::~string(local_3f8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3d8);
      __gnu_cxx::
      __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>::
      operator++(&local_250);
    }
    std::__cxx11::ostringstream::ostringstream(local_570);
    std::ostream::operator<<(local_570,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    Log(this,3,
        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmCTest.cxx"
        ,0x4a2,pcVar5,false);
    std::__cxx11::string::~string((string *)&cp);
    std::__cxx11::ostringstream::~ostringstream(local_570);
    cp_00 = cmsysProcess_New();
    local_598 = cp_00;
    tick = (size_type)
           std::vector<const_char_*,_std::allocator<const_char_*>_>::begin
                     ((vector<const_char_*,_std::allocator<const_char_*>_> *)&a);
    ppcVar6 = __gnu_cxx::
              __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
              ::operator*((__normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                           *)&tick);
    cmsysProcess_SetCommand(cp_00,ppcVar6);
    cmsysProcess_SetWorkingDirectory(local_598,dir);
    cmsysProcess_SetOption(local_598,0,1);
    cmsysProcess_SetTimeout
              (local_598,
               (double)args.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    cmsysProcess_Execute(local_598);
    tick_len = 0;
    tick_line_len = 0x400;
    data = (char *)0x32;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_740);
    poVar7 = std::operator<<((ostream *)local_740,"   Each . represents ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,tick_line_len);
    poVar7 = std::operator<<(poVar7," bytes of output");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    poVar7 = std::operator<<(poVar7,"    ");
    std::ostream::operator<<(poVar7,std::flush<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    Log(this,2,
        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmCTest.cxx"
        ,0x4b5,pcVar5,false);
    std::__cxx11::string::~string(local_760);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_740);
    while (iVar3 = cmsysProcess_WaitForData
                             (local_598,&stack0xfffffffffffffa40,&local_5c4,(double *)0x0),
          iVar3 != 0) {
      for (local_764 = 0; local_764 < local_5c4; local_764 = local_764 + 1) {
        if (pcStack_5c0[local_764] == '\0') {
          pcStack_5c0[local_764] = '\n';
        }
      }
      std::__cxx11::string::append((char *)output,(ulong)pcStack_5c0);
      while (uVar8 = std::__cxx11::string::size(), tick_len * tick_line_len < uVar8) {
        tick_len = tick_len + 1;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_8e0);
        poVar7 = std::operator<<((ostream *)local_8e0,".");
        std::ostream::operator<<(poVar7,std::flush<char,std::char_traits<char>>);
        std::__cxx11::ostringstream::str();
        pcVar5 = (char *)std::__cxx11::string::c_str();
        Log(this,2,
            "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmCTest.cxx"
            ,0x4c3,pcVar5,false);
        std::__cxx11::string::~string(local_900);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_8e0);
        if ((tick_len % (ulong)data == 0) && (tick_len != 0)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a78);
          poVar7 = std::operator<<((ostream *)local_a78,"  Size: ");
          uVar9 = std::__cxx11::string::size();
          auVar11._8_4_ = (int)((ulong)uVar9 >> 0x20);
          auVar11._0_8_ = uVar9;
          auVar11._12_4_ = 0x45300000;
          poVar7 = (ostream *)
                   std::ostream::operator<<
                             (poVar7,(int)(((auVar11._8_8_ - 1.9342813113834067e+25) +
                                           ((double)CONCAT44(0x43300000,(int)uVar9) -
                                           4503599627370496.0)) * 0.0009765625 + 1.0));
          poVar7 = std::operator<<(poVar7,"K");
          poVar7 = (ostream *)
                   std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          poVar7 = std::operator<<(poVar7,"    ");
          std::ostream::operator<<(poVar7,std::flush<char,std::char_traits<char>>);
          std::__cxx11::ostringstream::str();
          pcVar5 = (char *)std::__cxx11::string::c_str();
          Log(this,2,
              "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmCTest.cxx"
              ,0x4ca,pcVar5,false);
          std::__cxx11::string::~string(local_a98);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_a78);
        }
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c10);
      cmCTestLogWrite::cmCTestLogWrite(&local_c20,pcStack_5c0,(long)local_5c4);
      ::operator<<((ostream *)local_c10,&local_c20);
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      Log(this,3,
          "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmCTest.cxx"
          ,0x4cd,pcVar5,false);
      std::__cxx11::string::~string(local_c40);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_c10);
      bVar1 = std::ios::operator_cast_to_bool
                        ((ios *)((long)&ofs->_vptr_basic_ostream +
                                (long)ofs->_vptr_basic_ostream[-3]));
      if (bVar1) {
        cmCTestLogWrite::cmCTestLogWrite(&local_c50,pcStack_5c0,(long)local_5c4);
        ::operator<<(ofs,&local_c50);
      }
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_dc8);
    poVar7 = std::operator<<((ostream *)local_dc8," Size of output: ");
    uVar9 = std::__cxx11::string::size();
    auVar12._8_4_ = (int)((ulong)uVar9 >> 0x20);
    auVar12._0_8_ = uVar9;
    auVar12._12_4_ = 0x45300000;
    poVar7 = (ostream *)
             std::ostream::operator<<
                       (poVar7,(int)(((auVar12._8_8_ - 1.9342813113834067e+25) +
                                     ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0))
                                    * 0.0009765625));
    poVar7 = std::operator<<(poVar7,"K");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    Log(this,1,
        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmCTest.cxx"
        ,0x4d4,pcVar5,false);
    std::__cxx11::string::~string(local_de8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_dc8);
    cmsysProcess_WaitForExit(local_598,(double *)0x0);
    this_local._4_4_ = cmsysProcess_GetState(local_598);
    if (this_local._4_4_ == 4) {
      iVar3 = cmsysProcess_GetExitValue(local_598);
      *retVal = iVar3;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_f68);
      poVar7 = std::operator<<((ostream *)local_f68,"Command exited with the value: ");
      pvVar10 = (void *)std::ostream::operator<<(poVar7,*retVal);
      std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      Log(this,3,
          "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmCTest.cxx"
          ,0x4de,pcVar5,false);
      std::__cxx11::string::~string(local_f88);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_f68);
    }
    else if (this_local._4_4_ == 2) {
      iVar3 = cmsysProcess_GetExitException(local_598);
      *retVal = iVar3;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1100);
      poVar7 = std::operator<<((ostream *)local_1100,"There was an exception: ");
      pvVar10 = (void *)std::ostream::operator<<(poVar7,*retVal);
      std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      Log(this,4,
          "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmCTest.cxx"
          ,0x4e4,pcVar5,false);
      std::__cxx11::string::~string(local_1120);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1100);
    }
    else if (this_local._4_4_ == 5) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1298);
      poVar7 = std::operator<<((ostream *)local_1298,"There was a timeout");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      Log(this,4,
          "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmCTest.cxx"
          ,0x4e8,pcVar5,false);
      std::__cxx11::string::~string(local_12b8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1298);
    }
    else if (this_local._4_4_ == 1) {
      std::__cxx11::string::operator+=((string *)output,"\n*** ERROR executing: ");
      pcVar5 = cmsysProcess_GetErrorString(local_598);
      std::__cxx11::string::operator+=((string *)output,pcVar5);
      std::__cxx11::string::operator+=((string *)output,"\n***The build process failed.");
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1430);
      poVar7 = std::operator<<((ostream *)local_1430,"There was an error: ");
      pcVar5 = cmsysProcess_GetErrorString(local_598);
      poVar7 = std::operator<<(poVar7,pcVar5);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      Log(this,5,
          "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmCTest.cxx"
          ,0x4f0,pcVar5,false);
      std::__cxx11::string::~string(local_1450);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1430);
    }
    cmsysProcess_Delete(local_598);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)&a);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_58);
  return this_local._4_4_;
}

Assistant:

int cmCTest::RunMakeCommand(const char* command, std::string& output,
  int* retVal, const char* dir, int timeout, std::ostream& ofs)
{
  // First generate the command and arguments
  std::vector<std::string> args = cmSystemTools::ParseArguments(command);

  if(args.size() < 1)
    {
    return false;
    }

  std::vector<const char*> argv;
  for(std::vector<std::string>::const_iterator a = args.begin();
    a != args.end(); ++a)
    {
    argv.push_back(a->c_str());
    }
  argv.push_back(0);

  output = "";
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, "Run command:");
  std::vector<const char*>::iterator ait;
  for ( ait = argv.begin(); ait != argv.end() && *ait; ++ ait )
    {
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, " \"" << *ait << "\"");
    }
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, std::endl);

  // Now create process object
  cmsysProcess* cp = cmsysProcess_New();
  cmsysProcess_SetCommand(cp, &*argv.begin());
  cmsysProcess_SetWorkingDirectory(cp, dir);
  cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);
  cmsysProcess_SetTimeout(cp, timeout);
  cmsysProcess_Execute(cp);

  // Initialize tick's
  std::string::size_type tick = 0;
  std::string::size_type tick_len = 1024;
  std::string::size_type tick_line_len = 50;

  char* data;
  int length;
  cmCTestLog(this, HANDLER_OUTPUT,
    "   Each . represents " << tick_len << " bytes of output" << std::endl
    << "    " << std::flush);
  while(cmsysProcess_WaitForData(cp, &data, &length, 0))
    {
    for(int cc =0; cc < length; ++cc)
      {
      if(data[cc] == 0)
        {
        data[cc] = '\n';
        }
      }
    output.append(data, length);
    while ( output.size() > (tick * tick_len) )
      {
      tick ++;
      cmCTestLog(this, HANDLER_OUTPUT, "." << std::flush);
      if ( tick % tick_line_len == 0 && tick > 0 )
        {
        cmCTestLog(this, HANDLER_OUTPUT,
                   "  Size: "
                   << int((double(output.size()) / 1024.0) + 1)
                   << "K" << std::endl
                   << "    " << std::flush);
        }
      }
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, cmCTestLogWrite(data, length));
    if ( ofs )
      {
      ofs << cmCTestLogWrite(data, length);
      }
    }
  cmCTestLog(this, OUTPUT, " Size of output: "
    << int(double(output.size()) / 1024.0) << "K" << std::endl);

  cmsysProcess_WaitForExit(cp, 0);

  int result = cmsysProcess_GetState(cp);

  if(result == cmsysProcess_State_Exited)
    {
    *retVal = cmsysProcess_GetExitValue(cp);
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, "Command exited with the value: "
      << *retVal << std::endl);
    }
  else if(result == cmsysProcess_State_Exception)
    {
    *retVal = cmsysProcess_GetExitException(cp);
    cmCTestLog(this, WARNING, "There was an exception: " << *retVal
      << std::endl);
    }
  else if(result == cmsysProcess_State_Expired)
    {
    cmCTestLog(this, WARNING, "There was a timeout" << std::endl);
    }
  else if(result == cmsysProcess_State_Error)
    {
    output += "\n*** ERROR executing: ";
    output += cmsysProcess_GetErrorString(cp);
    output += "\n***The build process failed.";
    cmCTestLog(this, ERROR_MESSAGE, "There was an error: "
      << cmsysProcess_GetErrorString(cp) << std::endl);
    }

  cmsysProcess_Delete(cp);

  return result;
}